

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

type * __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as<(anonymous_namespace)::ns::Value>
          (type *__return_storage_ptr__,
          basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  bool bVar1;
  conv_error *this_00;
  error_category *peVar2;
  error_code ec;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = is_object(this);
  if (bVar1) {
    (__return_storage_ptr__->name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->name).field_2;
    (__return_storage_ptr__->name)._M_string_length = 0;
    (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->value = 0;
    local_40._M_dataplus._M_p = (pointer)0x4;
    local_40._M_string_length = 0x7b451f;
    bVar1 = contains(this,(string_view_type *)&local_40);
    if (bVar1) {
      local_40._M_dataplus._M_p = (pointer)0x4;
      local_40._M_string_length = 0x7b451f;
      json_traits_helper<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
      set_udt_member<std::__cxx11::string>
                (this,(string_view_type *)&local_40,&__return_storage_ptr__->name);
    }
    local_40._M_dataplus._M_p = &DAT_00000005;
    local_40._M_string_length = 0x656e00;
    bVar1 = contains(this,(string_view_type *)&local_40);
    if (bVar1) {
      local_40._M_dataplus._M_p = &DAT_00000005;
      local_40._M_string_length = 0x656e00;
      json_traits_helper<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::set_udt_member<int>(this,(string_view_type *)&local_40,&__return_storage_ptr__->value);
    }
    return __return_storage_ptr__;
  }
  this_00 = (conv_error *)__cxa_allocate_exception(0x58);
  peVar2 = conv_error_category();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Not a ns::Value",&local_41);
  ec._M_cat = peVar2;
  ec._0_8_ = 1;
  conv_error::conv_error(this_00,ec,&local_40);
  __cxa_throw(this_00,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }